

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void IoTHubClientCore_LL_DoWork(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  DLIST_ENTRY_TAG **ppDStack_38;
  IOTHUB_PROCESS_ITEM_RESULT process_results;
  IOTHUB_IDENTITY_INFO identity_info;
  IOTHUB_DEVICE_TWIN *queue_data;
  PDLIST_ENTRY next_item;
  DLIST_ENTRY *client_item;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle != (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    client_item = &iotHubClientHandle->waitingToSend;
    handleData = iotHubClientHandle;
    DoTimeouts(iotHubClientHandle);
    next_item = client_item[1].Flink;
    while (next_item != client_item + 1) {
      queue_data = (IOTHUB_DEVICE_TWIN *)next_item->Flink;
      ppDStack_38 = &next_item[-3].Blink;
      identity_info = (IOTHUB_IDENTITY_INFO)ppDStack_38;
      iVar1 = (*(code *)client_item[7].Blink)(client_item[3].Flink,1,&stack0xffffffffffffffc8);
      if ((iVar1 == 3) || (iVar1 == 2)) break;
      DList_RemoveEntryList(next_item);
      if (iVar1 == 0) {
        DList_InsertTailList(&handleData->iot_ack_queue,&(identity_info.device_twin)->entry);
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_DoWork",0x867,1,"Failure queue processing item");
        }
        device_twin_data_destroy(identity_info.device_twin);
      }
      next_item = (PDLIST_ENTRY)queue_data;
    }
    (*(code *)client_item[0xc].Flink)(client_item[3].Flink);
  }
  return;
}

Assistant:

void IoTHubClientCore_LL_DoWork(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)
{
    if (iotHubClientHandle != NULL)
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        DoTimeouts(handleData);

        DLIST_ENTRY* client_item = handleData->iot_msg_queue.Flink;
        while (client_item != &(handleData->iot_msg_queue)) /*while we are not at the end of the list*/
        {
            PDLIST_ENTRY next_item = client_item->Flink;

            IOTHUB_DEVICE_TWIN* queue_data = containingRecord(client_item, IOTHUB_DEVICE_TWIN, entry);
            IOTHUB_IDENTITY_INFO identity_info;
            identity_info.device_twin = queue_data;
            IOTHUB_PROCESS_ITEM_RESULT process_results =  handleData->IoTHubTransport_ProcessItem(handleData->transportHandle, IOTHUB_TYPE_DEVICE_TWIN, &identity_info);
            if (process_results == IOTHUB_PROCESS_CONTINUE || process_results == IOTHUB_PROCESS_NOT_CONNECTED)
            {
                break;
            }
            else
            {
                DList_RemoveEntryList(client_item);
                if (process_results == IOTHUB_PROCESS_OK)
                {
                    DList_InsertTailList(&(iotHubClientHandle->iot_ack_queue), &(queue_data->entry));
                }
                else
                {
                    LogError("Failure queue processing item");
                    device_twin_data_destroy(queue_data);
                }
            }
            // Move along to the next item
            client_item = next_item;
        }

        handleData->IoTHubTransport_DoWork(handleData->transportHandle);
    }
}